

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::ServiceOptions::ByteSizeLong(ServiceOptions *this)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  Rep *pRVar5;
  long lVar6;
  long lVar7;
  
  sVar3 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  lVar7 = (long)(this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  pRVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 != (Rep *)0x0) {
    pRVar5 = (Rep *)pRVar5->elements;
  }
  sVar3 = sVar3 + lVar7 * 2;
  if (lVar7 != 0) {
    lVar6 = 0;
    do {
      sVar4 = UninterpretedOption::ByteSizeLong
                        (*(UninterpretedOption **)((long)pRVar5->elements + lVar6 + -8));
      uVar2 = (uint)sVar4 | 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6);
      lVar6 = lVar6 + 8;
    } while (lVar7 * 8 != lVar6);
  }
  sVar4 = sVar3 + 3;
  if (((this->_has_bits_).has_bits_[0] & 1) == 0) {
    sVar4 = sVar3;
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar4;
    return sVar4;
  }
  sVar3 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar4,
                     &this->_cached_size_);
  return sVar3;
}

Assistant:

size_t ServiceOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.ServiceOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2UL * this->_internal_uninterpreted_option_size();
  for (const auto& msg : this->uninterpreted_option_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // optional bool deprecated = 33 [default = false];
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    total_size += 2 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}